

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

bool __thiscall
VulkanUtilities::VulkanInstance::IsLayerAvailable
          (VulkanInstance *this,char *LayerName,uint32_t *Version)

{
  bool bVar1;
  int iVar2;
  reference __s1;
  VkLayerProperties *Layer;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range1;
  uint32_t *Version_local;
  char *LayerName_local;
  VulkanInstance *this_local;
  
  __end1 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::begin
                     (&this->m_Layers);
  Layer = (VkLayerProperties *)
          std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::end(&this->m_Layers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                                *)&Layer);
    if (!bVar1) {
      return false;
    }
    __s1 = __gnu_cxx::
           __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
           ::operator*(&__end1);
    iVar2 = strcmp(__s1->layerName,LayerName);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
    ::operator++(&__end1);
  }
  *Version = __s1->specVersion;
  return true;
}

Assistant:

bool VulkanInstance::IsLayerAvailable(const char* LayerName, uint32_t& Version) const
{
    for (const auto& Layer : m_Layers)
    {
        if (strcmp(Layer.layerName, LayerName) == 0)
        {
            Version = Layer.specVersion;
            return true;
        }
    }
    return false;
}